

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_filepath.hpp
# Opt level: O2

void __thiscall iutest::detail::iuFilePath::iuFilePath(iuFilePath *this,string *path)

{
  std::__cxx11::string::string((string *)this,(string *)path);
  Normalize(this);
  return;
}

Assistant:

explicit iuFilePath(const ::std::string& path) : m_path(path)
    {
        Normalize();
    }